

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codepage.cpp
# Opt level: O1

void test_with_0<wchar_t>(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  bool bVar5;
  string a;
  string local_d0;
  char *local_b0;
  size_t local_a8;
  char local_a0 [16];
  wchar_t *local_90;
  long local_88;
  wchar_t local_80 [4];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  builtin_strncpy(local_a0,"abc",4);
  local_a0[4] = '\0';
  local_a0[5] = ' ';
  local_a0[6] = 'y';
  local_a0[7] = 'z';
  test_counter = test_counter + 1;
  local_a0[8] = '\0';
  local_a0[9] = '\0';
  local_a8 = 9;
  local_b0 = local_a0;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"UTF-8","");
  booster::locale::conv::to_utf<wchar_t>
            ((char *)&local_90,local_b0,(string *)(local_b0 + local_a8),(method_type)local_50);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"UTF-8","");
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)&local_d0,local_90,(string *)(local_90 + local_88),(method_type)local_70);
  if (local_d0._M_string_length == local_a8) {
    if (local_d0._M_string_length == 0) {
      bVar5 = true;
    }
    else {
      iVar2 = bcmp(local_d0._M_dataplus._M_p,local_b0,local_d0._M_string_length);
      bVar5 = iVar2 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  paVar1 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (!bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x104);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,
               " booster::locale::conv::from_utf<Char>(booster::locale::conv::to_utf<Char>(a,\"UTF-8\"),\"UTF-8\") == a"
               ,99);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    iVar2 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar2;
    if (bVar5) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar4,&local_d0);
      __cxa_throw(prVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"ISO8859-1","");
  booster::locale::conv::to_utf<wchar_t>
            ((char *)&local_90,local_b0,(string *)(local_b0 + local_a8),(method_type)local_50);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"ISO8859-1","");
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)&local_d0,local_90,(string *)(local_90 + local_88),(method_type)local_70);
  if (local_d0._M_string_length == local_a8) {
    if (local_d0._M_string_length == 0) {
      bVar5 = true;
    }
    else {
      iVar2 = bcmp(local_d0._M_dataplus._M_p,local_b0,local_d0._M_string_length);
      bVar5 = iVar2 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (!bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x105);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,
               " booster::locale::conv::from_utf<Char>(booster::locale::conv::to_utf<Char>(a,\"ISO8859-1\"),\"ISO8859-1\") == a"
               ,0x6b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    iVar2 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar2;
    if (bVar5) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar4,&local_d0);
      __cxa_throw(prVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  return;
}

Assistant:

void test_to_neg(std::string source,std::basic_string<Char> target,std::string encoding)
{
    using namespace booster::locale::conv;
    booster::locale::generator g;
    std::locale l=g("en_US."+encoding);

    TEST(to_utf<Char>(source,encoding)==target);
    TEST(to_utf<Char>(source.c_str(),encoding)==target);
    TEST(to_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding)==target);
    TEST(to_utf<Char>(source,l)==target);
    TEST(to_utf<Char>(source.c_str(),l)==target);
    TEST(to_utf<Char>(source.c_str(),source.c_str()+source.size(),l)==target);

    TESTF(to_utf<Char>(source,encoding,stop));
    TESTF(to_utf<Char>(source.c_str(),encoding,stop));
    TESTF(to_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding,stop));
    TESTF(to_utf<Char>(source,l,stop));
    TESTF(to_utf<Char>(source.c_str(),l,stop));
    TESTF(to_utf<Char>(source.c_str(),source.c_str()+source.size(),l,stop));
}